

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.h
# Opt level: O2

void __thiscall merlin::lbp::accept_incoming(lbp *this,size_t n)

{
  pointer pmVar1;
  pointer peVar2;
  
  pmVar1 = (this->super_factor_graph).super_graphical_model.super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  factor::operator=((this->m_beliefs).
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start + n,
                    (this->super_factor_graph).super_graphical_model.m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start + n);
  for (peVar2 = *(pointer *)
                 &pmVar1[n].super_my_vector<merlin::edge_id>.
                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
      peVar2 != *(pointer *)
                 ((long)&pmVar1[n].super_my_vector<merlin::edge_id>.
                         super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
      peVar2 = peVar2 + 1) {
    factor::operator=((this->m_msg).
                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                      super__Vector_impl_data._M_start + peVar2->ridx,
                      (this->m_msg_new).
                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                      super__Vector_impl_data._M_start + peVar2->ridx);
    factor::binaryOpIP<merlin::factor::binOpTimes>
              ((this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
               ._M_impl.super__Vector_impl_data._M_start + n,
               (this->m_msg).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
               _M_impl.super__Vector_impl_data._M_start + peVar2->ridx);
    if ((this->m_sched).t_ == Priority) {
      indexed_heap::erase(&this->m_priority,peVar2->ridx);
    }
  }
  factor::sum((this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
              _M_impl.super__Vector_impl_data._M_start + n);
  factor::binaryOpIP<merlin::factor::binOpDivide>
            ((this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
             _M_impl.super__Vector_impl_data._M_start + n);
  return;
}

Assistant:

void accept_incoming(size_t n) {
		const my_set<edge_id>& nbrs = neighbors(n); // get the list of neighbors
		bel(n) = get_factor(n); //   and start with just the local factor
		for (my_set<edge_id>::const_iterator i = nbrs.begin();
				i != nbrs.end(); ++i) {
			m_msg[i->ridx] = m_msg_new[i->ridx]; // accept each new incoming message
			bel(n) *= m_msg[i->ridx];           //   and include it in the belief
			if (m_sched == Schedule::Priority) {
				m_priority.erase(i->ridx); // accepted => remove from priority_ queue
			}
		}
		bel(n) /= bel(n).sum(); // normalize belief
	}